

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::parse_statements(Parser *this)

{
  int iVar1;
  ostream *poVar2;
  
  poVar2 = std::operator<<((ostream *)this->out_file,"\t\t<statements>");
  std::endl<char,std::char_traits<char>>(poVar2);
  while (iVar1 = Tokenizer::get_keyword_val(this->tokenizer,&this->cur_token), iVar1 - 9U < 6) {
    query_tokenizer(this);
    switch(iVar1) {
    case 9:
      parse_let_statement(this);
      break;
    case 10:
      parse_if_statement(this);
      break;
    case 0xc:
      parse_while_statement(this);
      break;
    case 0xd:
      parse_return_statement(this);
      break;
    case 0xe:
      parse_do_statement(this);
    }
  }
  poVar2 = std::operator<<((ostream *)this->out_file,"\t\t</statements>");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void Parser::parse_statements() {
    out_file << "\t\t<statements>" << std::endl;

    int keyword = tokenizer.get_keyword_val(cur_token);

    while (keyword >= LET && keyword <= DO) {
        query_tokenizer();

        switch (keyword) {

            case LET:
                parse_let_statement();
                break;

            case IF:
                parse_if_statement();
                break;

            case WHILE:
                parse_while_statement();
                break;

            case RETURN:
                parse_return_statement();
                break;

            case DO:
                parse_do_statement();
                break;
        }
        keyword = tokenizer.get_keyword_val(cur_token);
    }
    out_file << "\t\t</statements>" << std::endl;
}